

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

void __thiscall ncnn::Mat::release(Mat *this)

{
  int *piVar1;
  
  piVar1 = this->refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (this->allocator == (Allocator *)0x0) {
        free(this->data);
      }
      else {
        (**(code **)(*(long *)this->allocator + 0x18))();
      }
    }
  }
  *(undefined8 *)((long)&this->refcount + 4) = 0;
  *(undefined8 *)((long)&this->elemsize + 4) = 0;
  this->data = (void *)0x0;
  this->refcount = (int *)0x0;
  this->dims = 0;
  this->w = 0;
  this->h = 0;
  this->c = 0;
  this->cstep = 0;
  return;
}

Assistant:

inline void Mat::release()
{
    if (refcount && NCNN_XADD(refcount, -1) == 1)
    {
        if (allocator)
            allocator->fastFree(data);
        else
            fastFree(data);
    }

    data = 0;

    elemsize = 0;
    elempack = 0;

    dims = 0;
    w = 0;
    h = 0;
    c = 0;

    cstep = 0;

    refcount = 0;
}